

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# urlapi.c
# Opt level: O1

_Bool Curl_is_absolute_url(char *url,char *buf,size_t buflen)

{
  byte bVar1;
  char cVar2;
  int iVar3;
  uint __c;
  size_t sVar4;
  
  if (buflen == 0) {
    return false;
  }
  sVar4 = 0;
  do {
    bVar1 = url[sVar4];
    if (bVar1 == 0x3a) {
      if (url[sVar4 + 1] != '/') goto LAB_001447dc;
      iVar3 = 1;
      if (buf != (char *)0x0) {
        cVar2 = '\0';
        goto LAB_00144807;
      }
    }
    else {
      if (bVar1 == 0) {
        return false;
      }
LAB_001447dc:
      iVar3 = Curl_isalnum((uint)bVar1);
      __c = (uint)bVar1;
      if ((iVar3 != 0) ||
         ((iVar3 = 2, __c < 0x2f && ((0x680000000000U >> ((ulong)__c & 0x3f) & 1) != 0)))) {
        if (buf == (char *)0x0) {
          iVar3 = 0;
        }
        else {
          iVar3 = tolower(__c);
          cVar2 = (char)iVar3;
          iVar3 = 0;
LAB_00144807:
          buf[sVar4] = cVar2;
        }
      }
    }
    if (iVar3 != 0) {
      if (iVar3 == 2) {
        return false;
      }
      return true;
    }
    sVar4 = sVar4 + 1;
    if (buflen == sVar4) {
      return false;
    }
  } while( true );
}

Assistant:

bool Curl_is_absolute_url(const char *url, char *buf, size_t buflen)
{
  size_t i;
#ifdef WIN32
  if(STARTS_WITH_DRIVE_PREFIX(url))
    return FALSE;
#endif
  for(i = 0; i < buflen && url[i]; ++i) {
    char s = url[i];
    if((s == ':') && (url[i + 1] == '/')) {
      if(buf)
        buf[i] = 0;
      return TRUE;
    }
    /* RFC 3986 3.1 explains:
      scheme      = ALPHA *( ALPHA / DIGIT / "+" / "-" / "." )
    */
    else if(ISALNUM(s) || (s == '+') || (s == '-') || (s == '.') ) {
      if(buf)
        buf[i] = (char)TOLOWER(s);
    }
    else
      break;
  }
  return FALSE;
}